

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenModuleRef BinaryenModuleParse(char *text)

{
  Module *this;
  Module *wasm;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  string_view in;
  undefined1 local_1f0 [392];
  undefined1 local_68 [8];
  Result<wasm::Ok> parsed;
  long local_30 [2];
  char local_20;
  
  this = (Module *)operator_new(0x3f0);
  ::wasm::Module::Module(this);
  wasm = (Module *)strlen(text);
  local_20 = '\0';
  in._M_str = (char *)((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  in._M_len = (size_t)text;
  ::wasm::WATParser::parseModule((Result<wasm::Ok> *)local_68,(WATParser *)this,wasm,in,in_R9);
  if (local_20 == '\x01') {
    local_20 = '\0';
    if ((long *)parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ != local_30) {
      operator_delete((void *)parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
                      local_30[0] + 1);
    }
  }
  if (parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
    return this;
  }
  ::wasm::Fatal::Fatal((Fatal *)local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1f0 + 0x10),(char *)local_68,
             parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
  ::wasm::Fatal::operator<<((Fatal *)local_1f0,(char (*) [2])0xe3236f);
  ::wasm::Fatal::~Fatal((Fatal *)local_1f0);
}

Assistant:

BinaryenModuleRef BinaryenModuleParse(const char* text) {
  auto* wasm = new Module;
  auto parsed = WATParser::parseModule(*wasm, text);
  if (auto* err = parsed.getErr()) {
    Fatal() << err->msg << "\n";
  }
  return wasm;
}